

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O3

Node __thiscall trieste::detail::Make::done(Make *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  runtime_error *this_01;
  Make *in_RSI;
  element_type *peVar4;
  Node NVar5;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  element_type *local_78;
  Token local_68;
  string local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68.def = (TokenDef *)this;
  term(in_RSI,(initializer_list<trieste::Token>)ZEXT816(0));
  peVar4 = (in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4->parent_ != (NodeDef *)0x0) {
    do {
      local_60._M_dataplus._M_p =
           (pointer)(peVar4->location_).source.
                    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_60._M_string_length =
           (size_type)
           (peVar4->location_).source.
           super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->
                 _M_use_count + 1;
        }
      }
      local_60.field_2._M_allocated_capacity._0_4_ = (undefined4)(peVar4->location_).pos;
      local_60.field_2._M_allocated_capacity._4_4_ =
           *(undefined4 *)((long)&(peVar4->location_).pos + 4);
      local_60.field_2._8_4_ = (undefined4)(peVar4->location_).len;
      local_60.field_2._12_4_ = *(undefined4 *)((long)&(peVar4->location_).len + 4);
      local_88 = (element_type *)&local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"this is unclosed","");
      make_error((Make *)&stack0xffffffffffffffc0,(Location *)in_RSI,&local_60);
      NodeDef::push_back(peVar4,(Node *)&stack0xffffffffffffffc0);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      if (local_88 != (element_type *)&local_78) {
        operator_delete(local_88,(size_t)((long)&(local_78->
                                                 super_enable_shared_from_this<trieste::NodeDef>).
                                                 _M_weak_this.
                                                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
      }
      term(in_RSI,(initializer_list<trieste::Token>)ZEXT816(0));
      std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<trieste::NodeDef,void>
                ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                 ((in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->parent_);
      p_Var3 = p_Stack_80;
      peVar4 = local_88;
      local_88 = (element_type *)0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar4;
      (in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
        }
      }
      term(in_RSI,(initializer_list<trieste::Token>)ZEXT816(0));
      peVar4 = (in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    } while (peVar4->parent_ != (NodeDef *)0x0);
  }
  peVar1 = (in_RSI->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 == peVar1) {
    (((Node *)&(local_68.def)->name)->
    super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
    _Var2._M_pi = (in_RSI->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68.def)->fl)->_M_pi = _Var2._M_pi;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      }
    }
    NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68.def;
    return (Node)NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"malformed AST");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Node done()
      {
        term();

        while (node->parent())
        {
          node->push_back(make_error(node->location(), "this is unclosed"));
          term();
          node = node->parent()->shared_from_this();
          term();
        }

        if (node != top)
          throw std::runtime_error("malformed AST");

        return top;
      }